

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ReadObjectTag(BCReaderState *s)

{
  uint32_t uVar1;
  JSAtom v;
  JSContext *ctx;
  BCReaderState *pBVar2;
  int iVar3;
  JSValueUnion p_00;
  JSRefCountHeader *p;
  JSValue this_obj;
  JSValue val;
  JSAtom atom;
  uint32_t prop_count;
  JSAtom local_4c;
  JSContext *local_48;
  uint32_t local_3c;
  BCReaderState *local_38;
  
  local_48 = s->ctx;
  this_obj = JS_NewObjectProtoClass(local_48,local_48->class_proto[1],1);
  p_00 = this_obj.u;
  iVar3 = BC_add_object_ref1(s,(JSObject *)p_00.ptr);
  if ((iVar3 == 0) && (iVar3 = bc_get_leb128(s,&local_3c), pBVar2 = s, uVar1 = local_3c, iVar3 == 0)
     ) {
    for (; local_38 = pBVar2, uVar1 != 0; uVar1 = uVar1 - 1) {
      iVar3 = bc_get_atom(s,&local_4c);
      if (iVar3 != 0) goto LAB_0013c3ec;
      val = JS_ReadObjectRec(s);
      ctx = local_48;
      v = local_4c;
      if ((int)val.tag == 6) {
        JS_FreeAtom(local_48,local_4c);
        goto LAB_0013c3ec;
      }
      iVar3 = JS_DefinePropertyValue(local_48,this_obj,local_4c,val,7);
      s = local_38;
      JS_FreeAtom(ctx,v);
      if (iVar3 < 0) goto LAB_0013c3ec;
      pBVar2 = local_38;
    }
  }
  else {
LAB_0013c3ec:
    if ((0xfffffff4 < (uint)this_obj.tag) &&
       (iVar3 = *p_00.ptr, *(int *)p_00.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(local_48->rt,this_obj);
    }
    this_obj = (JSValue)(ZEXT816(6) << 0x40);
  }
  return this_obj;
}

Assistant:

static JSValue JS_ReadObjectTag(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSValue obj;
    uint32_t prop_count, i;
    JSAtom atom;
    JSValue val;
    int ret;
    
    obj = JS_NewObject(ctx);
    if (BC_add_object_ref(s, obj))
        goto fail;
    if (bc_get_leb128(s, &prop_count))
        goto fail;
    for(i = 0; i < prop_count; i++) {
        if (bc_get_atom(s, &atom))
            goto fail;
#ifdef DUMP_READ_OBJECT
        bc_read_trace(s, "propname: "); print_atom(s->ctx, atom); printf("\n");
#endif
        val = JS_ReadObjectRec(s);
        if (JS_IsException(val)) {
            JS_FreeAtom(ctx, atom);
            goto fail;
        }
        ret = JS_DefinePropertyValue(ctx, obj, atom, val, JS_PROP_C_W_E);
        JS_FreeAtom(ctx, atom);
        if (ret < 0)
            goto fail;
    }
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}